

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef rec_mm_arith(jit_State *J,RecordIndex *ix,MMS mm)

{
  TRef *pTVar1;
  TValue *pTVar2;
  BCReg func;
  int iVar3;
  TRef extraout_EAX;
  code *cont;
  
  cont = lj_cont_ra;
  if (mm == MM_concat) {
    cont = lj_cont_cat;
  }
  func = rec_mm_prep(J,cont);
  pTVar1 = J->base;
  pTVar2 = J->L->base;
  pTVar1[(ulong)func + 2] = ix->tab;
  pTVar1[(ulong)func + 3] = ix->key;
  pTVar2[(ulong)func + 2].gcr.gcptr64 = (uint64_t)ix->tabv;
  pTVar2[(ulong)func + 3] = ix->keyv;
  iVar3 = lj_record_mm_lookup(J,ix,mm);
  if (iVar3 == 0) {
    if (mm != MM_unm) {
      ix->tab = ix->key;
      ix->tabv = ix->keyv;
      iVar3 = lj_record_mm_lookup(J,ix,mm);
      if (iVar3 != 0) goto LAB_001315df;
    }
    lj_trace_err(J,LJ_TRERR_NOMM);
  }
LAB_001315df:
  pTVar1[func] = ix->mobj;
  pTVar1[(ulong)func + 1] = 0;
  pTVar2[func] = ix->mobjv;
  lj_record_call(J,func,2);
  return extraout_EAX;
}

Assistant:

static TRef rec_mm_arith(jit_State *J, RecordIndex *ix, MMS mm)
{
  /* Set up metamethod call first to save ix->tab and ix->tabv. */
  BCReg func = rec_mm_prep(J, mm == MM_concat ? lj_cont_cat : lj_cont_ra);
  TRef *base = J->base + func;
  TValue *basev = J->L->base + func;
  base[1+LJ_FR2] = ix->tab; base[2+LJ_FR2] = ix->key;
  copyTV(J->L, basev+1+LJ_FR2, &ix->tabv);
  copyTV(J->L, basev+2+LJ_FR2, &ix->keyv);
  if (!lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
    if (mm != MM_unm) {
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, &ix->keyv);
      if (lj_record_mm_lookup(J, ix, mm))  /* Lookup mm on 2nd operand. */
	goto ok;
    }
    lj_trace_err(J, LJ_TRERR_NOMM);
  }
ok:
  base[0] = ix->mobj;
#if LJ_FR2
  base[1] = 0;
#endif
  copyTV(J->L, basev+0, &ix->mobjv);
  lj_record_call(J, func, 2);
  return 0;  /* No result yet. */
}